

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::FindLSBCase::compare(FindLSBCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  int i_1;
  uint uVar9;
  ostringstream *this_00;
  int i;
  int iVar10;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if ((int)uVar4 < 1) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
    uVar8 = 0;
    do {
      uVar7 = *(uint *)((long)*inputs + uVar8 * 4);
      iVar2 = *(int *)((long)*outputs + uVar8 * 4);
      iVar10 = 0;
      do {
        if ((1 << ((byte)iVar10 & 0x1f) & (2 << ((&DAT_01c5ce10)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1U
            & uVar7) != 0) goto LAB_014b52dc;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x20);
      iVar10 = -1;
LAB_014b52dc:
      uVar9 = 0;
      do {
        if ((uVar7 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_014b52f4;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x20);
      uVar9 = 0xffffffff;
LAB_014b52f4:
      if ((iVar2 < iVar10) || ((int)uVar9 < iVar2)) {
        this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] in range [",0xc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        return bVar6;
      }
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      bVar6 = (int)uVar4 <= (int)uVar7;
    } while (uVar7 != uVar4);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= findLSB(value&mask);
			const int		maxRef	= findLSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}